

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bad_identifiers_proto2.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestConflictingMethodNames::Closure
          (TestConflictingMethodNames *this,RpcController *controller,DummyMessage *param_2,
          DummyMessage *param_3,Closure *done)

{
  allocator<char> local_51;
  string local_50 [32];
  Closure *local_30;
  Closure *done_local;
  DummyMessage *param_3_local;
  DummyMessage *param_2_local;
  RpcController *controller_local;
  TestConflictingMethodNames *this_local;
  
  local_30 = done;
  done_local = (Closure *)param_3;
  param_3_local = param_2;
  param_2_local = (DummyMessage *)controller;
  controller_local = (RpcController *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"Method Closure() not implemented.",&local_51);
  (*controller->_vptr_RpcController[6])(controller,local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  (*local_30->_vptr_Closure[2])();
  return;
}

Assistant:

void TestConflictingMethodNames::Closure(::google::protobuf::RpcController* PROTOBUF_NULLABLE controller,
                         const ::proto2_unittest::DummyMessage* PROTOBUF_NONNULL,
                         ::proto2_unittest::DummyMessage* PROTOBUF_NONNULL,
                         ::google::protobuf::Closure* PROTOBUF_NULLABLE done) {
  controller->SetFailed("Method Closure() not implemented.");
  done->Run();
}